

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  FxJumpStatement *pFVar2;
  ExpEmit EVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t unaff_R12;
  ulong uVar9;
  
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    if (pFVar1->ValueType == (PType *)TypeBool) {
      iVar4 = (*pFVar1->_vptr_FxExpression[3])();
      if ((char)iVar4 == '\0') goto LAB_00671401;
      pFVar1 = this->Condition;
    }
    if (pFVar1 != (FxExpression *)0x0) {
      __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                    ,0x1213,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
    }
  }
LAB_00671401:
  pFVar1 = this->Init;
  if ((pFVar1 != (FxExpression *)0x0) &&
     (uVar5 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build), (uVar5 & 0x3fc00) == 0)) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar5 >> 8 & 3),uVar5 & 0xff,1);
  }
  sVar6 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    uVar5 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
    VMFunctionBuilder::Emit(build,0x36,uVar5 & 0xff,0);
    if ((uVar5 & 0x3fc00) == 0) {
      VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar5 >> 8 & 3),uVar5 & 0xff,1)
      ;
    }
    unaff_R12 = VMFunctionBuilder::Emit(build,0x37,0);
  }
  pFVar1 = this->Code;
  if ((pFVar1 != (FxExpression *)0x0) &&
     (uVar5 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build), (uVar5 & 0x3fc00) == 0)) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar5 >> 8 & 3),uVar5 & 0xff,1);
  }
  sVar7 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Iteration;
  if ((pFVar1 != (FxExpression *)0x0) &&
     (uVar5 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build), (uVar5 & 0x3fc00) == 0)) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar5 >> 8 & 3),uVar5 & 0xff,1);
  }
  sVar8 = VMFunctionBuilder::Emit(build,0x37,0);
  VMFunctionBuilder::Backpatch(build,sVar8,sVar6);
  sVar6 = VMFunctionBuilder::GetAddress(build);
  if (this->Condition != (FxExpression *)0x0) {
    VMFunctionBuilder::Backpatch(build,unaff_R12,sVar6);
  }
  if ((this->super_FxExpression).JumpAddresses.Count != 0) {
    uVar9 = 0;
    do {
      pFVar2 = (this->super_FxExpression).JumpAddresses.Array[uVar9];
      sVar8 = sVar7;
      if (*(int *)&(pFVar2->super_FxExpression).field_0x34 == 0x125) {
        sVar8 = sVar6;
      }
      VMFunctionBuilder::Backpatch(build,pFVar2->Address,sVar8);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->super_FxExpression).JumpAddresses.Count);
  }
  EVar3.RegNum = '\0';
  EVar3.RegType = 0xff;
  EVar3._2_1_ = 0;
  return EVar3;
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	size_t jumpspot;

	// Init statement.
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		ExpEmit cond = Condition->Emit(build);
		build->Emit(OP_TEST, cond.RegNum, 0);
		cond.Free(build);
		jumpspot = build->Emit(OP_JMP, 0);
	}

	// Execute the loop's content.
	if (Code != nullptr)
	{
		ExpEmit code = Code->Emit(build);
		code.Free(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	if (Condition != nullptr)
	{
		build->Backpatch(jumpspot, loopend);
	}

	// Give a proper address to any break/continue statement within this loop.
	for (unsigned int i = 0; i < JumpAddresses.Size(); i++)
	{
		if (JumpAddresses[i]->Token == TK_Break)
		{
			build->Backpatch(JumpAddresses[i]->Address, loopend);
		}
		else
		{ // Continue statement.
			build->Backpatch(JumpAddresses[i]->Address, loopstart);
		}
	}

	return ExpEmit();
}